

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void generate<trng::yarn5s>(size_t samples,unsigned_long seed)

{
  int iVar1;
  result_type rVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong in_RSI;
  ulong in_RDI;
  size_t j;
  yarn5s r;
  parameter_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  result_type in_stack_ffffffffffffffa4;
  ulong local_40;
  
  trng::yarn5s::yarn5s
            ((yarn5s *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"# generator ");
  pcVar4 = trng::yarn5s::name();
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"  seed = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "#==================================================================\n");
  poVar3 = std::operator<<(poVar3,"type: d\n");
  poVar3 = std::operator<<(poVar3,"count: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"numbit: ");
  trng::yarn5s::max();
  trng::yarn5s::min();
  iVar1 = trng::int_math::log2_ceil<int>(0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,'\n');
  for (local_40 = 0; local_40 < in_RDI; local_40 = local_40 + 1) {
    in_stack_ffffffffffffffa4 =
         trng::yarn5s::operator()
                   ((yarn5s *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    rVar2 = trng::yarn5s::min();
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,in_stack_ffffffffffffffa4 - rVar2);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}